

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::CommandRunner::OnAssertUnlinkableCommand
          (CommandRunner *this,AssertUnlinkableCommand *command)

{
  uint32_t line_number;
  pointer pcVar1;
  string_view module_filename;
  Ref *pRVar2;
  Enum EVar3;
  RefVec imports;
  Errors errors;
  Ptr local_d8;
  Ptr local_b8;
  Ptr local_a0;
  RefVec local_88;
  Errors local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_68.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  module_filename.data_ = (command->filename)._M_dataplus._M_p;
  module_filename.size_ = (command->filename)._M_string_length;
  ReadModule(&local_b8,this,module_filename,&local_68);
  if (local_b8.obj_ == (Module *)0x0) {
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)5>).super_Command.line,
               "unable to compile unlinkable module: \"%s\"",(command->filename)._M_dataplus._M_p);
    EVar3 = Error;
  }
  else {
    local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PopulateImports(this,&local_b8,&local_88);
    local_d8.root_index_ = 0;
    local_d8.obj_ = (Trap *)0x0;
    local_d8.store_ = (Store *)0x0;
    if (local_b8.store_ == (Store *)0x0) {
      pRVar2 = (Ref *)&wabt::interp::Ref::Null;
    }
    else {
      pRVar2 = wabt::interp::FreeList<wabt::interp::Ref>::Get
                         (&(local_b8.store_)->roots_,local_b8.root_index_);
    }
    wabt::interp::Instance::Instantiate
              (&local_a0,&this->store_,(Ref)pRVar2->index,&local_88,&local_d8);
    line_number = (command->super_CommandMixin<(wabt::CommandType)5>).super_Command.line;
    if (local_d8.obj_ == (Trap *)0x0) {
      PrintError(this,line_number,"expected module to be unlinkable: \"%s\"",
                 (command->filename)._M_dataplus._M_p);
      EVar3 = Error;
    }
    else {
      pcVar1 = ((local_d8.obj_)->message_)._M_dataplus._M_p;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_48,pcVar1,pcVar1 + ((local_d8.obj_)->message_)._M_string_length);
      PrintError(this,line_number,"assert_unlinkable passed:\n  error: %s",local_48[0]);
      EVar3 = Ok;
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
        EVar3 = Ok;
      }
    }
    if (local_a0.obj_ != (Instance *)0x0) {
      wabt::interp::Store::DeleteRoot(local_a0.store_,local_a0.root_index_);
    }
    if (local_d8.obj_ != (Trap *)0x0) {
      wabt::interp::Store::DeleteRoot(local_d8.store_,local_d8.root_index_);
    }
    if (local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_b8.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(local_b8.store_,local_b8.root_index_);
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_68);
  return (Result)EVar3;
}

Assistant:

wabt::Result CommandRunner::OnAssertUnlinkableCommand(
    const AssertUnlinkableCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);

  if (!module) {
    PrintError(command->line, "unable to compile unlinkable module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (!trap) {
    PrintError(command->line, "expected module to be unlinkable: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  // TODO: Change to one-line error.
  PrintError(command->line, "assert_unlinkable passed:\n  error: %s",
             trap->message().c_str());
  return wabt::Result::Ok;
}